

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall QGridLayout::setRowStretch(QGridLayout *this,int row,int stretch)

{
  QGridLayoutPrivate *this_00;
  int c;
  pointer piVar1;
  int r;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  r = row + 1;
  if (row + 1 < this_00->rr) {
    r = this_00->rr;
  }
  c = 0;
  if (0 < this_00->cc) {
    c = this_00->cc;
  }
  QGridLayoutPrivate::setSize(this_00,r,c);
  piVar1 = QList<int>::data(&this_00->rStretch);
  piVar1[row] = stretch;
  this_00->field_0x194 = this_00->field_0x194 | 4;
  this_00->hfw_width = -1;
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QGridLayout::setRowStretch(int row, int stretch)
{
    Q_D(QGridLayout);
    d->setRowStretch(row, stretch);
    invalidate();
}